

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_4::Validator::OnReturnCallIndirectExpr
          (Validator *this,ReturnCallIndirectExpr *expr)

{
  Location *default_loc;
  Result RVar1;
  Var local_c0;
  Var local_78;
  
  default_loc = &(expr->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc;
  GetFuncTypeIndex(&local_78,(Validator *)this->current_module_,default_loc,&expr->decl);
  Var::Var(&local_c0,&expr->table);
  RVar1 = SharedValidator::OnReturnCallIndirect(&this->validator_,default_loc,&local_78,&local_c0);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  return (Result)Ok;
}

Assistant:

Result Validator::OnReturnCallIndirectExpr(ReturnCallIndirectExpr* expr) {
  result_ |= validator_.OnReturnCallIndirect(
      expr->loc, GetFuncTypeIndex(expr->loc, expr->decl), expr->table);
  return Result::Ok;
}